

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupWithoutPos(Aig_Man_t *p)

{
  char *pcVar1;
  void *pvVar2;
  Aig_Man_t *p_00;
  size_t sVar3;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Type_t AVar8;
  Aig_Obj_t *p1;
  long lVar9;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar1);
    pcVar4 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar4,pcVar1);
  }
  p_00->pName = pcVar4;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar1);
    pcVar4 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar4,pcVar1);
  }
  p_00->pSpec = pcVar4;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar9];
      pAVar5 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
      lVar9 = lVar9 + 1;
      pVVar7 = p->vCis;
    } while (lVar9 < pVVar7->nSize);
  }
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar9];
      if (pvVar2 != (void *)0x0) {
        AVar8 = (Aig_Type_t)*(undefined8 *)((long)pvVar2 + 0x18);
        if ((AVar8 & AIG_OBJ_VOID) == AIG_OBJ_BUF) {
          __assert_fail("!Aig_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                        ,0x354,"Aig_Man_t *Aig_ManDupWithoutPos(Aig_Man_t *)");
        }
        AVar8 = AVar8 & AIG_OBJ_VOID;
        if (0xfffffffd < AVar8 - AIG_OBJ_VOID) {
          if (((ulong)pvVar2 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
          }
          uVar6 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
          }
          pAVar5 = Aig_Oper(p_00,pAVar5,p1,AVar8);
          *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
          pVVar7 = p->vObjs;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar7->nSize);
  }
  if ((p->nObjs[4] == 0) && (p->nObjs[6] + p->nObjs[5] != p_00->nObjs[6] + p_00->nObjs[5])) {
    __assert_fail("Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                  ,0x358,"Aig_Man_t *Aig_ManDupWithoutPos(Aig_Man_t *)");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupWithoutPos( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        assert( !Aig_ObjIsBuf(pObj) );
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
    }
    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    return pNew;
}